

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.hpp
# Opt level: O2

void __thiscall
flexfloat<(unsigned_char)'\x03',_(unsigned_char)'\x03'>::flexfloat<double>
          (flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> *this,double *w)

{
  (this->v).value = *w;
  (this->v).desc.exp_bits = '\x03';
  (this->v).desc.frac_bits = '\x03';
  flexfloat_sanitize(&this->v);
  return;
}

Assistant:

INLINE flexfloat (const U &w)
    {
#ifdef FLEXFLOAT_STATS
        if(flexfloat_stats_enabled) {
            FlexfloatPrecision p = get_type_precision(w);
            if(flexfloat_vectorization) vcasting_stats[make_precision(p.first, p.second, exp_bits, frac_bits)].total++;
            else casting_stats[make_precision(p.first, p.second, exp_bits, frac_bits)].total++;
        }
#endif
        v.value = fp_t(w);
        v.desc.exp_bits = exp_bits;
        v.desc.frac_bits = frac_bits;

        flexfloat_sanitize(&v);
    }